

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

char find_placeholder_char(Am_Object *cmd,Am_Slot_Key slot)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  char unaff_R12B;
  Am_Object ph;
  Am_Value_List placeholders;
  Am_Value v;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Value local_38;
  
  pAVar3 = Am_Object::Get(cmd,Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,3);
  Am_Value_List::Am_Value_List(&local_48,pAVar3);
  bVar1 = Am_Value_List::Valid(&local_48);
  if (bVar1) {
    local_38.type = 0;
    local_38.value.wrapper_value = (Am_Wrapper *)0x0;
    local_50.data = (Am_Object_Data *)0x0;
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"searching placeholders ",0x17);
      poVar4 = operator<<((ostream *)&std::cout,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," for slot ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::ostream::flush();
    }
    Am_Value_List::Start(&local_48);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_48);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&local_48);
      Am_Object::operator=(&local_50,pAVar3);
      pAVar3 = Am_Object::Get(&local_50,0x19c,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      if ((Am_Slot_Key)iVar2 == slot) {
        pAVar3 = Am_Object::Get(&local_50,0x153,0);
        unaff_R12B = Am_Value::operator_cast_to_char(pAVar3);
        break;
      }
      Am_Value_List::Next(&local_48);
    }
    Am_Object::~Am_Object(&local_50);
    Am_Value::~Am_Value(&local_38);
    if (!bVar1) goto LAB_00217efb;
  }
  unaff_R12B = '\0';
LAB_00217efb:
  Am_Value_List::~Am_Value_List(&local_48);
  return unaff_R12B;
}

Assistant:

char
find_placeholder_char(Am_Object &cmd, Am_Slot_Key slot)
{
  Am_Value_List placeholders =
      cmd.Get(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (placeholders.Valid()) {
    Am_Value v;
    Am_Object ph;
    if (am_sdebug)
      std::cout << "searching placeholders " << placeholders << " for slot "
                << slot << std::endl
                << std::flush;
    Am_Slot_Key found_slot;
    for (placeholders.Start(); !placeholders.Last(); placeholders.Next()) {
      ph = placeholders.Get();
      found_slot = (Am_Slot_Key)(int)ph.Get(Am_SLOT_FOR_VALUE);
      if (found_slot == slot) {
        char ret = ph.Get(Am_ID);
        return ret;
      }
    }
  }
  return 0;
}